

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracing.cpp
# Opt level: O1

Vec3 compute_sample_color(Ray *ray,Object *list,int depth)

{
  char cVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  float fVar2;
  Vec3 VVar3;
  Vec3 VVar4;
  Vec3 _emitted;
  Vec3 _attenuation;
  hit_record_t _hit_record;
  Ray _scattered;
  Vec3 local_a0;
  Vec3 local_94;
  undefined1 local_88 [4];
  undefined1 local_84 [4];
  undefined1 local_80 [4];
  undefined1 local_7c [28];
  long *local_60;
  undefined1 local_54 [52];
  Vec3 VVar5;
  float fVar6;
  float fVar7;
  
  fVar2 = 3.4028235e+38;
  cVar1 = (**(code **)(*(long *)CONCAT44(in_register_00000014,depth) + 0x10))
                    (0x3a83126f,(long *)CONCAT44(in_register_00000014,depth),list,local_88);
  if (cVar1 == '\0') {
    VVar3 = compute_background_color(ray);
  }
  else {
    (**(code **)(*local_60 + 0x18))(&local_a0,local_60,local_7c,local_84,local_80);
    if ((in_ECX < 0x32) &&
       (cVar1 = (**(code **)(*local_60 + 0x10))(local_60,list,local_88,&local_94,local_54 + 0x18),
       cVar1 != '\0')) {
      compute_sample_color((Ray *)local_54,(Object *)(local_54 + 0x18),depth);
      operator*(&local_94,(Vec3 *)local_54);
      VVar3 = operator+(&local_a0,(Vec3 *)(local_54 + 0xc));
      VVar5.e[0] = VVar3.e[0];
      VVar4.e[1] = VVar3.e[1];
      register0x00001240 = VVar3.e[2];
      return (Vec3)VVar5.e;
    }
    *(undefined8 *)(ray->m_origin).e = local_a0.e._0_8_;
    VVar3.e[1] = 0.0;
    VVar3.e[0] = local_a0.e[2];
    VVar3.e[2] = fVar2;
    (ray->m_origin).e[2] = local_a0.e[2];
  }
  VVar4.e[0] = VVar3.e[0];
  VVar4.e[1] = VVar3.e[1];
  register0x00001240 = VVar3.e[2];
  return (Vec3)VVar4.e;
}

Assistant:

Vec3
compute_sample_color(const Ray& ray, Object *list, int depth)
{
    hit_record_t _hit_record;
    if(list->Intersect(ray, RT_MIN_INTERSECTION_T, std::numeric_limits<float>::max(), _hit_record)) {
        Ray  _scattered;
        Vec3 _attenuation;
		Vec3 _emitted = _hit_record.m_material->Emitted(_hit_record.m_point, _hit_record.m_u, _hit_record.m_v);
        if (depth < RT_MAX_DEPTH && _hit_record.m_material->Scatter(ray, _hit_record, _attenuation, _scattered)) {
            return _emitted + _attenuation * compute_sample_color(_scattered, list, depth+1);
        }
        else {
            return _emitted;
        }
    }

    return compute_background_color(ray);
}